

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

Expression *
slang::ast::ConversionExpression::fromSyntax
          (Compilation *compilation,SignedCastExpressionSyntax *syntax,ASTContext *context)

{
  SourceRange range;
  bool bVar1;
  bitmask<slang::ast::ASTFlags> extraFlags;
  SourceLocation SVar2;
  SourceLocation in_RDX;
  Compilation *in_RSI;
  SourceLocation in_RDI;
  bitmask<slang::ast::IntegralFlags> flags;
  Diagnostic *diag;
  ConversionExpression *result;
  Expression *operand;
  Expression *in_stack_ffffffffffffff18;
  Compilation *in_stack_ffffffffffffff20;
  Type *in_stack_ffffffffffffff28;
  SourceLocation SVar3;
  ASTContext *in_stack_ffffffffffffff30;
  DiagCode code;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Diagnostic *in_stack_ffffffffffffff70;
  not_null<const_slang::ast::Type_*> local_88;
  bitmask<slang::ast::IntegralFlags> local_7c;
  underlying_type local_7b;
  underlying_type local_7a;
  bitmask<slang::ast::IntegralFlags> local_79;
  SourceLocation local_78;
  SourceLocation local_70;
  SourceLocation local_68;
  undefined4 local_5c;
  SourceLocation local_58;
  SourceRange local_50;
  undefined4 local_3c;
  ConversionExpression *local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  Expression *local_28;
  bitwidth_t width;
  SourceLocation SVar4;
  bitmask<slang::ast::IntegralFlags> flags_00;
  ConversionExpression *local_8;
  
  SVar2 = in_RDI;
  extraFlags.m_bits =
       (underlying_type)
       not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::operator*
                 ((not_null<slang::syntax::ParenthesizedExpressionSyntax_*> *)0x9f8bfd);
  SVar3 = in_RDX;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,None);
  local_28 = Expression::selfDetermined
                       ((Compilation *)in_RDI,(ExpressionSyntax *)in_stack_ffffffffffffff30,
                        (ASTContext *)in_stack_ffffffffffffff28,extraFlags);
  SVar4 = SVar2;
  Compilation::getErrorType((Compilation *)SVar2);
  flags_00.m_bits = SVar4._7_1_;
  local_3c = 3;
  local_50 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff70);
  local_38 = BumpAllocator::
             emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange>
                       ((BumpAllocator *)SVar2,(Type *)in_RDX,(ConversionKind *)extraFlags.m_bits,
                        (Expression *)in_RDI,(SourceRange *)in_stack_ffffffffffffff30);
  code = SUB84(extraFlags.m_bits >> 0x20,0);
  bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff20);
  if (bVar1) {
    local_8 = (ConversionExpression *)
              Expression::badExpr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else if ((short)(in_RSI->options).maxCheckerInstanceDepth == 0x7d) {
    (local_38->super_Expression).type.ptr = (local_28->type).ptr;
    local_8 = local_38;
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9f8d46);
    bVar1 = Type::isIntegral((Type *)in_stack_ffffffffffffff20);
    if (bVar1) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9f8e39)
      ;
      width = SVar3._4_4_;
      local_7a = (underlying_type)Type::getIntegralFlags(in_stack_ffffffffffffff28);
      local_7b = (underlying_type)ast::operator~(TwoState);
      local_79 = bitmask<slang::ast::IntegralFlags>::operator&
                           ((bitmask<slang::ast::IntegralFlags> *)in_stack_ffffffffffffff28,
                            (bitmask<slang::ast::IntegralFlags> *)in_stack_ffffffffffffff20);
      if ((short)(in_RSI->options).maxCheckerInstanceDepth == 0x116) {
        bitmask<slang::ast::IntegralFlags>::bitmask(&local_7c,Signed);
        bitmask<slang::ast::IntegralFlags>::operator|=(&local_79,&local_7c);
      }
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9f8eb2)
      ;
      Type::getBitWidth(in_stack_ffffffffffffff28);
      Compilation::getType(in_RSI,width,flags_00);
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                (&local_88,(Type **)&stack0xffffffffffffff70);
      (local_38->super_Expression).type.ptr = local_88.ptr;
      local_8 = local_38;
    }
    else {
      local_5c = 0x250007;
      local_68 = parsing::Token::location((Token *)&(in_RSI->options).maxConstexprBacktrace);
      SVar2 = (SourceLocation)ASTContext::addDiag(in_stack_ffffffffffffff30,code,in_RDI);
      local_58 = SVar2;
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9f8dc8);
      ast::operator<<(in_stack_ffffffffffffff70,
                      (Type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      local_78 = (local_28->sourceRange).startLoc;
      local_70 = (local_28->sourceRange).endLoc;
      range.endLoc = SVar2;
      range.startLoc = SVar3;
      Diagnostic::operator<<((Diagnostic *)in_stack_ffffffffffffff20,range);
      local_8 = (ConversionExpression *)
                Expression::badExpr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& ConversionExpression::fromSyntax(Compilation& compilation,
                                             const SignedCastExpressionSyntax& syntax,
                                             const ASTContext& context) {
    auto& operand = selfDetermined(compilation, *syntax.inner, context);
    auto result = compilation.emplace<ConversionExpression>(compilation.getErrorType(),
                                                            ConversionKind::Explicit, operand,
                                                            syntax.sourceRange());
    if (operand.bad())
        return badExpr(compilation, result);

    // SignedCastExpression can also represent a const cast, which does nothing
    // and passes the type through unchanged.
    if (syntax.signing.kind == TokenKind::ConstKeyword) {
        result->type = operand.type;
        return *result;
    }

    if (!operand.type->isIntegral()) {
        auto& diag = context.addDiag(diag::BadIntegerCast, syntax.apostrophe.location());
        diag << *operand.type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    auto flags = operand.type->getIntegralFlags() & ~IntegralFlags::Signed;
    if (syntax.signing.kind == TokenKind::SignedKeyword)
        flags |= IntegralFlags::Signed;

    result->type = &compilation.getType(operand.type->getBitWidth(), flags);
    return *result;
}